

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O1

uint aom_avg_8x8_c(uint8_t *s,int p)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  ulong uVar5;
  undefined1 auVar6 [13];
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  iVar9 = 0;
  iVar8 = 0;
  do {
    iVar10 = 0;
    iVar11 = 0;
    iVar12 = 0;
    lVar7 = 0;
    do {
      uVar1 = *(undefined4 *)(s + lVar7);
      uVar5 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
      auVar2._8_4_ = 0;
      auVar2._0_8_ = uVar5;
      auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
      auVar3[8] = (char)((uint)uVar1 >> 0x10);
      auVar3._0_8_ = uVar5;
      auVar3[9] = 0;
      auVar3._10_3_ = auVar2._10_3_;
      auVar6._5_8_ = 0;
      auVar6._0_5_ = auVar3._8_5_;
      auVar4[4] = (char)((uint)uVar1 >> 8);
      auVar4._0_4_ = (int)uVar5;
      auVar4[5] = 0;
      auVar4._6_7_ = SUB137(auVar6 << 0x40,6);
      iVar9 = iVar9 + (int)uVar5;
      iVar10 = iVar10 + auVar4._4_4_;
      iVar11 = iVar11 + auVar3._8_4_;
      iVar12 = iVar12 + (uint)(uint3)(auVar2._10_3_ >> 0x10);
      lVar7 = lVar7 + 4;
    } while (lVar7 != 8);
    iVar9 = iVar12 + iVar10 + iVar11 + iVar9;
    iVar8 = iVar8 + 1;
    s = s + p;
  } while (iVar8 != 8);
  return iVar9 + 0x20 >> 6;
}

Assistant:

unsigned int aom_avg_8x8_c(const uint8_t *s, int p) {
  int i, j;
  int sum = 0;
  for (i = 0; i < 8; ++i, s += p)
    for (j = 0; j < 8; sum += s[j], ++j) {
    }

  return (sum + 32) >> 6;
}